

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O1

boolean fill_mem_input_buffer(j_decompress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  jpeg_source_mgr *pjVar2;
  
  pjVar1 = cinfo->err;
  pjVar1->msg_code = 0x78;
  (*pjVar1->emit_message)((j_common_ptr)cinfo,-1);
  pjVar2 = cinfo->src;
  pjVar2->next_input_byte = fill_mem_input_buffer::mybuffer;
  pjVar2->bytes_in_buffer = 2;
  return 1;
}

Assistant:

METHODDEF(boolean)
fill_mem_input_buffer(j_decompress_ptr cinfo)
{
  static const JOCTET mybuffer[4] = {
    (JOCTET)0xFF, (JOCTET)JPEG_EOI, 0, 0
  };

  /* The whole JPEG data is expected to reside in the supplied memory
   * buffer, so any request for more data beyond the given buffer size
   * is treated as an error.
   */
  WARNMS(cinfo, JWRN_JPEG_EOF);

  /* Insert a fake EOI marker */

  cinfo->src->next_input_byte = mybuffer;
  cinfo->src->bytes_in_buffer = 2;

  return TRUE;
}